

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O2

void __thiscall trackerboy::apu::NoiseChannel::fastforward(NoiseChannel *this,uint32_t cycles)

{
  uint32_t uVar1;
  bool bVar2;
  
  uVar1 = Timer::fastforward(&(this->super_Channel).mTimer,cycles);
  if (this->mValidScf == true) {
    while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
      clockLfsr(this);
    }
    (this->super_Channel).mOutput = ((byte)this->mLfsr | 0xfe) + 1 & this->mEnvelope->mVolume;
  }
  return;
}

Assistant:

void NoiseChannel::fastforward(uint32_t cycles) noexcept {

    auto clocks = timer().fastforward(cycles);
    if (mValidScf) {
        while (clocks) {
            clockLfsr();
            --clocks;
        }
        updateOutput();
    }
}